

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entt.hpp
# Opt level: O2

object_type * __thiscall
entt::basic_storage<entt::entity,Swarm,void>::construct<Swarm_const&>
          (basic_storage<entt::entity,Swarm,void> *this,entity_type entt,Swarm *args)

{
  Swarm local_14;
  
  std::vector<Swarm,_std::allocator<Swarm>_>::emplace_back<Swarm>
            ((vector<Swarm,_std::allocator<Swarm>_> *)(this + 0x38),&local_14);
  sparse_set<entt::entity>::construct((sparse_set<entt::entity> *)this,entt);
  return (object_type *)(*(long *)(this + 0x40) + -4);
}

Assistant:

object_type & construct(const entity_type entt, Args &&... args) {
        if constexpr(std::is_aggregate_v<object_type>) {
            instances.emplace_back(Type{std::forward<Args>(args)...});
        } else {
            instances.emplace_back(std::forward<Args>(args)...);
        }

        // entity goes after component in case constructor throws
        underlying_type::construct(entt);
        return instances.back();
    }